

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

BYTE HexToByte(char *hex)

{
  char cVar1;
  int i;
  long lVar2;
  byte bVar3;
  byte bVar4;
  
  bVar3 = 0;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    cVar1 = hex[lVar2];
    bVar4 = cVar1 - 0x30;
    if ((bVar4 < 10) || (bVar4 = cVar1 + 0xbf, bVar4 < 6)) {
      bVar3 = bVar4 | bVar3 * '\x10';
    }
    else {
      bVar3 = cVar1 + bVar3 * '\x10' + 0x9f;
    }
  }
  return bVar3;
}

Assistant:

static BYTE HexToByte (const char *hex)
{
	BYTE v = 0;
	for (int i = 0; i < 2; ++i)
	{
		v <<= 4;
		if (hex[i] >= '0' && hex[i] <= '9')
		{
			v += hex[i] - '0';
		}
		else if (hex[i] >= 'A' && hex[i] <= 'F')
		{
			v += hex[i] - 'A';
		}
		else // The string is already verified to contain valid hexits
		{
			v += hex[i] - 'a';
		}
	}
	return v;
}